

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

TPZManVector<double,_10> * __thiscall
TPZManVector<double,_10>::operator=(TPZManVector<double,_10> *this,TPZManVector<double,_10> *rval)

{
  ulong uVar1;
  double *pdVar2;
  int iVar3;
  ulong uVar4;
  double *pdVar5;
  
  if (this == rval) goto LAB_00b2fb06;
  uVar1 = (rval->super_TPZVec<double>).fNElements;
  pdVar2 = (this->super_TPZVec<double>).fStore;
  pdVar5 = this->fExtAlloc;
  if (pdVar2 != pdVar5 && pdVar2 != (double *)0x0) {
    operator_delete__(pdVar2);
    (this->super_TPZVec<double>).fStore = (double *)0x0;
  }
  if ((long)uVar1 < 0xb) {
    uVar4 = 0;
    iVar3 = 0;
    if (0 < (long)uVar1) {
      do {
        pdVar5[uVar4] = rval->fExtAlloc[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
      iVar3 = (int)uVar1;
      if (9 < uVar1) {
        uVar4 = 0;
        goto LAB_00b2fafa;
      }
    }
    memset((void *)((long)this->fExtAlloc + (ulong)(uint)(iVar3 * 8)),0,
           (ulong)(iVar3 * -8 + 0x48) + 8);
    uVar4 = 0;
  }
  else {
    pdVar5 = (rval->super_TPZVec<double>).fStore;
    uVar4 = uVar1;
  }
LAB_00b2fafa:
  (this->super_TPZVec<double>).fStore = pdVar5;
  (this->super_TPZVec<double>).fNAlloc = uVar4;
  (this->super_TPZVec<double>).fNElements = uVar1;
LAB_00b2fb06:
  (rval->super_TPZVec<double>).fStore = (double *)0x0;
  (rval->super_TPZVec<double>).fNElements = 0;
  (rval->super_TPZVec<double>).fNAlloc = 0;
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(TPZManVector< T, NumExtAlloc >&& rval) {
    // Checking auto assignment.
    if (this != &rval) {
      const int64_t nel = rval.NElements();
      //let us dispose of previously allocated memory
      if (this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = nullptr;
        this->fNAlloc = 0;
      }
      if (nel <= NumExtAlloc) {
        //we need to copy, unfortunately
        int i = 0;
        for(; i < nel; i++) {fExtAlloc[i] = rval.fExtAlloc[i];}
        for(; i < NumExtAlloc; i++){fExtAlloc[i] = T();}
        this->fStore = fExtAlloc;
        this->fNAlloc = 0;
        this->fNElements = nel;
      } else {
        this->fStore = rval.fStore;
        this->fNAlloc = nel;
        this->fNElements = nel;
      }
    }
    rval.fStore = nullptr;
    rval.fNAlloc = 0;
    rval.fNElements = 0;
    return *this;
}